

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

Oop __thiscall
Lodtalk::MethodCompiler::visitAssignmentExpression(MethodCompiler *this,AssignmentExpression *node)

{
  uint uVar1;
  Node *pNVar2;
  IdentifierExpression *this_00;
  VariableLookupPtr *pVVar3;
  element_type *peVar4;
  undefined1 local_50 [8];
  VariableLookupPtr variable;
  IdentifierExpression *identExpr;
  Node *reference;
  Node *value;
  AssignmentExpression *node_local;
  MethodCompiler *this_local;
  
  pNVar2 = AST::AssignmentExpression::getValue(node);
  (*pNVar2->_vptr_Node[2])(pNVar2,this);
  this_00 = (IdentifierExpression *)AST::AssignmentExpression::getReference(node);
  uVar1 = (*(this_00->super_Node)._vptr_Node[4])();
  if ((uVar1 & 1) == 0) {
    fprintf(_stderr,"The method %s is unimplemented in %s at line %d\n",
            "virtual Oop Lodtalk::MethodCompiler::visitAssignmentExpression(AssignmentExpression *)"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/Compiler.cpp"
            ,0x455);
    abort();
  }
  variable.super___shared_ptr<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
  pVVar3 = AST::IdentifierExpression::getVariable(this_00);
  std::shared_ptr<Lodtalk::VariableLookup>::shared_ptr
            ((shared_ptr<Lodtalk::VariableLookup> *)local_50,pVVar3);
  peVar4 = std::
           __shared_ptr_access<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Lodtalk::VariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_50);
  (*peVar4->_vptr_VariableLookup[7])(peVar4,&this->gen,this->localContext);
  Oop::Oop((Oop *)&this_local);
  std::shared_ptr<Lodtalk::VariableLookup>::~shared_ptr
            ((shared_ptr<Lodtalk::VariableLookup> *)local_50);
  return (Oop)(anon_union_8_4_0eb573b0_for_Oop_0)this_local;
}

Assistant:

Oop MethodCompiler::visitAssignmentExpression(AssignmentExpression *node)
{
    // Generate the value
    auto value = node->getValue();
    value->acceptVisitor(this);

    // Ensure the reference is an identifier expression.
    auto reference = node->getReference();
    if(!reference->isIdentifierExpression())
        LODTALK_UNIMPLEMENTED();

    // Perform the assignment.
    auto identExpr = static_cast<AST::IdentifierExpression*> (reference);
    auto variable = identExpr->getVariable();
    variable->generateStore(gen, localContext);

    return Oop();
}